

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_scalar.hpp
# Opt level: O2

void __thiscall
cfgfile::
tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
::tag_scalar_t(tag_scalar_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfgfile::string_trait_t>
               *this,tag_t<cfgfile::string_trait_t> *owner,string_t *name,bool is_mandatory)

{
  tag_t<cfgfile::string_trait_t>::tag_t
            (&this->super_tag_t<cfgfile::string_trait_t>,owner,name,is_mandatory);
  (this->super_tag_t<cfgfile::string_trait_t>)._vptr_tag_t =
       (_func_int **)&PTR__tag_scalar_t_00136b18;
  (this->m_value)._M_dataplus._M_p = (pointer)&(this->m_value).field_2;
  (this->m_value)._M_string_length = 0;
  (this->m_value).field_2._M_local_buf[0] = '\0';
  this->m_constraint =
       (constraint_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  return;
}

Assistant:

tag_scalar_t( tag_t< Trait > & owner, const typename Trait::string_t & name,
		bool is_mandatory = false )
		:	tag_t< Trait >( owner, name, is_mandatory )
		,	m_value( typename Trait::string_t() )
		,	m_constraint( nullptr )
	{
	}